

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall Units_setGetUnitId_Test::TestBody(Units_setGetUnitId_Test *this)

{
  element_type *peVar1;
  byte bVar2;
  char *pcVar3;
  Message local_c0 [8];
  AssertHelper local_b8 [8];
  AssertionResult gtest_ar_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  UnitsPtr units;
  string id1;
  string id2;
  string oor;
  
  libcellml::Units::create();
  peVar1 = units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&id1,"second",(allocator<char> *)&id2);
  libcellml::Units::addUnit((string *)peVar1);
  std::__cxx11::string::~string((string *)&id1);
  peVar1 = units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&id1,"metre",(allocator<char> *)&id2)
  ;
  libcellml::Units::addUnit((string *)peVar1);
  std::__cxx11::string::~string((string *)&id1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&id1,"id1",(allocator<char> *)&id2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&id2,"id2",(allocator<char> *)&oor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&oor,"out_of_range",(allocator<char> *)&local_a0);
  gtest_ar_.success_ =
       (bool)libcellml::Units::setUnitId
                       ((ulong)units.
                               super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(string *)0x0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a0,&gtest_ar_.success_,"units->setUnitId(0, id1)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xa0c,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_b8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_b8);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       (bool)libcellml::Units::setUnitId
                       ((ulong)units.
                               super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(string *)0x1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a0,&gtest_ar_.success_,"units->setUnitId(1, id2)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xa0d,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_b8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_b8);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar2 = libcellml::Units::setUnitId
                    ((ulong)units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,(string *)0x63);
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar2 != 0) {
    testing::Message::Message(local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_a0,&gtest_ar_.success_,"units->setUnitId(99, oor)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xa0e,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_b8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_b8);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Units::unitId_abi_cxx11_((ulong)&local_a0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_,"id1","units->unitId(0)",&id1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xa10,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Units::unitId_abi_cxx11_((ulong)&local_a0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_,"id2","units->unitId(1)",&id2,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xa11,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Units::unitId_abi_cxx11_((ulong)&local_a0);
  pcVar3 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar_,"\"\"","units->unitId(99)",(char (*) [1])0x14bb90,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (gtest_ar_.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xa12,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&oor);
  std::__cxx11::string::~string((string *)&id2);
  std::__cxx11::string::~string((string *)&id1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, setGetUnitId)
{
    auto units = libcellml::Units::create();
    units->addUnit("second");
    units->addUnit("metre");

    const std::string id1 = "id1";
    const std::string id2 = "id2";
    const std::string oor = "out_of_range";

    EXPECT_TRUE(units->setUnitId(0, id1));
    EXPECT_TRUE(units->setUnitId(1, id2));
    EXPECT_FALSE(units->setUnitId(99, oor));

    EXPECT_EQ(id1, units->unitId(0));
    EXPECT_EQ(id2, units->unitId(1));
    EXPECT_EQ("", units->unitId(99));
}